

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64
drwav_read_pcm_frames_s32__msadpcm(drwav *pWav,drwav_uint64 framesToRead,drwav_int32 *pBufferOut)

{
  drwav_uint64 dVar1;
  drwav_int32 *in_RDX;
  drwav *in_RSI;
  drwav_uint64 in_RDI;
  drwav_uint64 framesRead;
  drwav_int16 samples16 [2048];
  drwav_uint64 totalFramesRead;
  drwav *pBufferOut_00;
  drwav_int16 local_1028 [2052];
  drwav_uint64 local_20;
  drwav_int32 *local_18;
  drwav *local_10;
  drwav_uint64 local_8;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  while( true ) {
    if (local_10 == (drwav *)0x0) {
      return local_20;
    }
    pBufferOut_00 = local_10;
    if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(*(ushort *)(local_8 + 0x70)),0) <=
        local_10) {
      pBufferOut_00 =
           SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800)) / ZEXT216(*(ushort *)(local_8 + 0x70)),0);
    }
    dVar1 = drwav_read_pcm_frames_s16(local_10,local_8,(drwav_int16 *)pBufferOut_00);
    if (dVar1 == 0) break;
    drwav_s16_to_s32(local_18,local_1028,dVar1 * *(ushort *)(local_8 + 0x70));
    local_18 = local_18 + dVar1 * *(ushort *)(local_8 + 0x70);
    local_10 = (drwav *)((long)local_10 - dVar1);
    local_20 = dVar1 + local_20;
  }
  return local_20;
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s32__msadpcm(drwav* pWav, drwav_uint64 framesToRead, drwav_int32* pBufferOut)
{
    /*
    We're just going to borrow the implementation from the drwav_read_s16() since ADPCM is a little bit more complicated than other formats and I don't
    want to duplicate that code.
    */
    drwav_uint64 totalFramesRead = 0;
    drwav_int16 samples16[2048];
    while (framesToRead > 0) {
        drwav_uint64 framesRead = drwav_read_pcm_frames_s16(pWav, drwav_min(framesToRead, drwav_countof(samples16)/pWav->channels), samples16);
        if (framesRead == 0) {
            break;
        }

        drwav_s16_to_s32(pBufferOut, samples16, (size_t)(framesRead*pWav->channels));   /* <-- Safe cast because we're clamping to 2048. */

        pBufferOut      += framesRead*pWav->channels;
        framesToRead    -= framesRead;
        totalFramesRead += framesRead;
    }

    return totalFramesRead;
}